

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::optimize_endpoint_comps(dxt1_endpoint_optimizer *this)

{
  uint64 uVar1;
  byte bVar2;
  uint16 l;
  bool bVar3;
  uint16 h;
  uchar *puVar4;
  byte *pbVar5;
  uint local_20a4;
  byte local_20a0;
  dxt1_solution_coordinates local_2074;
  ulong local_2070;
  uint64 e;
  uint8 c1;
  uint64 uStack_2060;
  uint16 packed_low;
  uint64 e0;
  uint8 c0;
  ulong uStack_2050;
  uint comp_limit;
  uint64 best_error;
  color_quad_u8 high;
  color_quad_u8 low;
  uint8 p1;
  uint8 p0;
  ulong uStack_2038;
  uint comp_index;
  uint64 best_remaining_error [4];
  uint64 error [4] [256];
  color_quad_u8 source_high;
  color_quad_u8 source_low;
  dxt1_endpoint_optimizer *this_local;
  
  compute_selectors(this);
  if ((((this->m_best_solution).m_alpha_block & 1U) == 0) && ((this->m_best_solution).m_error != 0))
  {
    dxt1_block::unpack_color
              ((dxt1_block *)((long)error[3] + 0x7fc),(this->m_best_solution).m_coords.m_low_color,
               true,0xff);
    dxt1_block::unpack_color
              ((dxt1_block *)(error[3] + 0xff),(this->m_best_solution).m_coords.m_high_color,true,
               0xff);
    for (low.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                       (anon_struct_4_4_d83cdc77_for_anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3_0
                        )0x0; (uint)low.field_0 < 3;
        low.field_0 = (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
                      ((int)low.field_0 + 1)) {
      puVar4 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)((long)error[3] + 0x7fc),
                          (uint)low.field_0);
      high.field_0.field_0.a = *puVar4;
      puVar4 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)(error[3] + 0xff),(uint)low.field_0);
      high.field_0.field_0.b = *puVar4;
      dxt1_block::unpack_color
                ((dxt1_block *)((long)&best_error + 4),(this->m_best_solution).m_coords.m_low_color,
                 false,0xff);
      dxt1_block::unpack_color
                ((dxt1_block *)&best_error,(this->m_best_solution).m_coords.m_high_color,false,0xff)
      ;
      compute_endpoint_component_errors
                (this,(uint)low.field_0,(uint64 (*) [4] [256])(best_remaining_error + 3),
                 (uint64 (*) [4])&stack0xffffffffffffdfc8);
      pbVar5 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)((long)&best_error + 4),
                          (uint)low.field_0);
      uVar1 = best_remaining_error[(ulong)*pbVar5 + 3];
      pbVar5 = color_quad<unsigned_char,_int>::operator[]
                         ((color_quad<unsigned_char,_int> *)&best_error,(uint)low.field_0);
      uStack_2050 = uVar1 + error[0][(ulong)*pbVar5 + 0xff] +
                    error[1][(long)(int)(((uint)high.field_0.field_0.a * 2 +
                                         (uint)high.field_0.field_0.b) / 3) + 0xff] +
                    error[2][(long)(int)(((uint)high.field_0.field_0.a +
                                         (uint)high.field_0.field_0.b * 2) / 3) + 0xff];
      if (uStack_2038 < uStack_2050) {
        e0._4_4_ = 0x20;
        if (low.field_0 == 1) {
          e0._4_4_ = 0x40;
        }
        for (e0._3_1_ = 0; bVar2 = e0._3_1_, e0._3_1_ < e0._4_4_; e0._3_1_ = e0._3_1_ + 1) {
          uStack_2060 = best_remaining_error[(ulong)e0._3_1_ + 3];
          if (uStack_2060 + best_remaining_error[0] < uStack_2050) {
            pbVar5 = color_quad<unsigned_char,_int>::operator[]
                               ((color_quad<unsigned_char,_int> *)((long)&best_error + 4),
                                (uint)low.field_0);
            *pbVar5 = bVar2;
            e._6_2_ = dxt1_block::pack_color((color_quad_u8 *)((long)&best_error + 4),false,0x7f);
            if (low.field_0 == 1) {
              local_20a0 = e0._3_1_ << 2 | (byte)((int)(uint)e0._3_1_ >> 4);
            }
            else {
              local_20a0 = e0._3_1_ << 3 | (byte)((int)(uint)e0._3_1_ >> 2);
            }
            high.field_0.field_0.a = local_20a0;
            for (e._5_1_ = 0; bVar2 = e._5_1_, e._5_1_ < e0._4_4_; e._5_1_ = e._5_1_ + 1) {
              local_2070 = uStack_2060 + error[0][(ulong)e._5_1_ + 0xff];
              if (local_2070 + best_remaining_error[1] < uStack_2050) {
                if (low.field_0 == 1) {
                  local_20a4 = (uint)e._5_1_ << 2 | (int)(uint)e._5_1_ >> 4;
                }
                else {
                  local_20a4 = (uint)e._5_1_ << 3 | (int)(uint)e._5_1_ >> 2;
                }
                high.field_0.field_0.b = (uchar)local_20a4;
                local_2070 = error[1][(long)(int)(((uint)high.field_0.field_0.a * 2 +
                                                  (local_20a4 & 0xff)) / 3) + 0xff] + local_2070;
                if ((local_2070 + best_remaining_error[2] < uStack_2050) &&
                   (local_2070 = error[2][(long)(int)(((uint)high.field_0.field_0.a +
                                                      (local_20a4 & 0xff) * 2) / 3) + 0xff] +
                                 local_2070, local_2070 < uStack_2050)) {
                  pbVar5 = color_quad<unsigned_char,_int>::operator[]
                                     ((color_quad<unsigned_char,_int> *)&best_error,
                                      (uint)low.field_0);
                  l = e._6_2_;
                  *pbVar5 = bVar2;
                  h = dxt1_block::pack_color((color_quad_u8 *)&best_error,false,0x7f);
                  dxt1_solution_coordinates::dxt1_solution_coordinates(&local_2074,l,h);
                  bVar3 = evaluate_solution(this,&local_2074,false);
                  if (((bVar3 ^ 0xffU) & 1) == 0) {
                    if ((this->m_best_solution).m_error == 0) {
                      return;
                    }
                    compute_selectors(this);
                    compute_endpoint_component_errors
                              (this,(uint)low.field_0,
                               (uint64 (*) [4] [256])(best_remaining_error + 3),
                               (uint64 (*) [4])&stack0xffffffffffffdfc8);
                    uStack_2050 = best_remaining_error[(ulong)e0._3_1_ + 3] +
                                  error[0][(ulong)e._5_1_ + 0xff] +
                                  error[1][(long)(int)(((uint)high.field_0.field_0.a * 2 +
                                                       (uint)high.field_0.field_0.b) / 3) + 0xff] +
                                  error[2][(long)(int)(((uint)high.field_0.field_0.a +
                                                       (uint)high.field_0.field_0.b * 2) / 3) + 0xff
                                          ];
                    uStack_2060 = best_remaining_error[(ulong)e0._3_1_ + 3];
                    if (uStack_2050 <= uStack_2060 + best_remaining_error[0]) break;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::optimize_endpoint_comps()
    {
        compute_selectors();
        if (m_best_solution.m_alpha_block || !m_best_solution.m_error)
        {
            return;
        }
        color_quad_u8 source_low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, true));
        color_quad_u8 source_high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, true));
        uint64 error[4][256], best_remaining_error[4];
        for (uint comp_index = 0; comp_index < 3; comp_index++)
        {
            uint8 p0 = source_low[comp_index];
            uint8 p1 = source_high[comp_index];
            color_quad_u8 low(dxt1_block::unpack_color(m_best_solution.m_coords.m_low_color, false));
            color_quad_u8 high(dxt1_block::unpack_color(m_best_solution.m_coords.m_high_color, false));
            compute_endpoint_component_errors(comp_index, error, best_remaining_error);
            uint64 best_error = error[0][low[comp_index]] + error[1][high[comp_index]] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
            if (best_remaining_error[0] >= best_error)
            {
                continue;
            }
            const uint comp_limit = comp_index == 1 ? 64 : 32;
            for (uint8 c0 = 0; c0 < comp_limit; c0++)
            {
                uint64 e0 = error[0][c0];
                if (e0 + best_remaining_error[1] >= best_error)
                {
                    continue;
                }
                low[comp_index] = c0;
                uint16 packed_low = dxt1_block::pack_color(low, false);
                p0 = comp_index == 1 ? c0 << 2 | c0 >> 4 : c0 << 3 | c0 >> 2;
                for (uint8 c1 = 0; c1 < comp_limit; c1++)
                {
                    uint64 e = e0 + error[1][c1];
                    if (e + best_remaining_error[2] >= best_error)
                    {
                        continue;
                    }
                    p1 = comp_index == 1 ? c1 << 2 | c1 >> 4 : c1 << 3 | c1 >> 2;
                    e += error[2][(p0 * 2 + p1) / 3];
                    if (e + best_remaining_error[3] >= best_error)
                    {
                        continue;
                    }
                    e += error[3][(p0 + p1 * 2) / 3];
                    if (e >= best_error)
                    {
                        continue;
                    }
                    high[comp_index] = c1;
                    if (!evaluate_solution(dxt1_solution_coordinates(packed_low, dxt1_block::pack_color(high, false))))
                    {
                        continue;
                    }
                    if (!m_best_solution.m_error)
                    {
                        return;
                    }
                    compute_selectors();
                    compute_endpoint_component_errors(comp_index, error, best_remaining_error);
                    best_error = error[0][c0] + error[1][c1] + error[2][(p0 * 2 + p1) / 3] + error[3][(p0 + p1 * 2) / 3];
                    e0 = error[0][c0];
                    if (e0 + best_remaining_error[1] >= best_error)
                    {
                        break;
                    }
                }
            }
        }
    }